

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O2

int LZ4_decompress_safe_usingDict
              (char *source,char *dest,int compressedSize,int maxOutputSize,char *dictStart,
              int dictSize)

{
  ushort *puVar1;
  char *pcVar2;
  char cVar3;
  byte bVar4;
  undefined8 uVar5;
  ushort uVar6;
  ushort uVar7;
  int iVar8;
  ushort *puVar9;
  ushort *puVar10;
  byte *pbVar11;
  byte *pbVar12;
  byte *pbVar13;
  long lVar14;
  int iVar15;
  ushort *puVar16;
  long lVar17;
  size_t __n;
  byte *pbVar18;
  uint uVar19;
  char *pcVar20;
  byte *pbVar21;
  long lVar22;
  size_t prefixSize;
  byte *pbVar23;
  uint uVar24;
  ulong uVar25;
  ulong uVar26;
  char *pcVar27;
  ushort *puVar28;
  ushort *puVar29;
  byte *pbVar30;
  char *pcVar31;
  byte *pbVar32;
  ulong uVar33;
  long lVar34;
  char *pcVar35;
  char *pcVar36;
  int iStack_40;
  
  iVar8 = (int)dest;
  iStack_40 = (int)source;
  if (dictSize == 0) {
    if (source == (char *)0x0) {
      return -1;
    }
    if (maxOutputSize == 0) {
      if (compressedSize != 1) {
        return -1;
      }
      return -(uint)(*source != '\0');
    }
    if (compressedSize == 0) {
      return -1;
    }
    puVar1 = (ushort *)(source + compressedSize);
    pbVar30 = (byte *)(dest + maxOutputSize);
    puVar28 = (ushort *)source;
    pbVar32 = (byte *)dest;
    if (maxOutputSize < 0x40) goto LAB_0010e2c5;
LAB_0010df6f:
    do {
      puVar9 = (ushort *)((long)puVar28 + 1);
      bVar4 = (byte)*puVar28;
      uVar33 = (ulong)(uint)(bVar4 >> 4);
      if (bVar4 >> 4 == 0xf) {
        if ((ushort *)((long)puVar1 - 0xfU) <= puVar9) goto LAB_0010e248;
        puVar29 = puVar28 + 1;
        uVar24 = 0;
        puVar28 = puVar28 + 8;
        do {
          puVar16 = puVar28;
          puVar10 = puVar9;
          puVar9 = (ushort *)((long)puVar10 + 1);
          uVar24 = uVar24 + *(byte *)((long)puVar16 + -0xf);
          puVar29 = (ushort *)((long)puVar29 + 1);
          puVar28 = (ushort *)((long)puVar16 + 1);
        } while (puVar16 + -7 < (ushort *)((long)puVar1 - 0xfU) &&
                 *(byte *)((long)puVar16 + -0xf) == 0xff);
        uVar33 = (ulong)uVar24 + 0xf;
        pbVar18 = pbVar32 + uVar33;
        if ((CARRY8((ulong)pbVar32,uVar33)) || ((ulong)-(long)puVar29 < uVar33)) {
          puVar9 = puVar16 + -7;
          goto LAB_0010e248;
        }
        if (dest + (long)maxOutputSize + -0x20 < pbVar18) goto LAB_0010e337;
        puVar28 = (ushort *)((ulong)uVar24 + (long)puVar16 + 1);
        if (puVar1 + -0x10 < puVar28) {
          puVar9 = puVar16 + -7;
          goto LAB_0010e337;
        }
        lVar22 = 0;
        do {
          uVar5 = *(undefined8 *)((byte *)((long)puVar9 + lVar22) + 8);
          pbVar11 = pbVar32 + lVar22;
          *(undefined8 *)pbVar11 = *(undefined8 *)((long)puVar9 + lVar22);
          *(undefined8 *)(pbVar11 + 8) = uVar5;
          pbVar13 = (byte *)((long)puVar10 + lVar22 + 0x11);
          uVar5 = *(undefined8 *)(pbVar13 + 8);
          *(undefined8 *)(pbVar11 + 0x10) = *(undefined8 *)pbVar13;
          *(undefined8 *)(pbVar11 + 0x18) = uVar5;
          lVar22 = lVar22 + 0x20;
        } while (pbVar11 + 0x20 < pbVar18);
      }
      else {
        pbVar18 = pbVar32 + uVar33;
        if ((ushort *)((long)puVar1 - 0x11U) < puVar9) goto LAB_0010e337;
        uVar5 = *(undefined8 *)((long)puVar28 + 9);
        *(undefined8 *)pbVar32 = *(undefined8 *)puVar9;
        *(undefined8 *)(pbVar32 + 8) = uVar5;
        puVar28 = (ushort *)(uVar33 + (long)puVar9);
      }
      uVar6 = *puVar28;
      uVar33 = (ulong)uVar6;
      puVar9 = puVar28 + 1;
      pbVar11 = pbVar18 + -uVar33;
      uVar26 = (ulong)(bVar4 & 0xf);
      if (uVar26 == 0xf) {
        if (pbVar11 < dest) goto LAB_0010e248;
        uVar24 = 0;
        puVar28 = puVar9;
        do {
          puVar9 = (ushort *)((long)puVar28 + 1);
          if (puVar1 + -2 <= puVar9) goto LAB_0010e248;
          uVar7 = *puVar28;
          uVar24 = uVar24 + (byte)uVar7;
          puVar28 = puVar9;
        } while ((byte)uVar7 == 0xff);
        uVar25 = (ulong)uVar24;
        if ((byte *)(-0x10 - uVar25) < pbVar18) goto LAB_0010e248;
        uVar26 = uVar25 + 0x13;
        if (pbVar30 + -0x40 <= pbVar18 + uVar25 + 0x13) goto LAB_0010e3e1;
      }
      else {
        pbVar32 = pbVar18 + uVar26 + 4;
        uVar26 = uVar26 + 4;
        if (pbVar30 + -0x40 <= pbVar32) goto LAB_0010e3e1;
        if ((dest <= pbVar11) && (7 < uVar6)) {
          *(undefined8 *)pbVar18 = *(undefined8 *)pbVar11;
          *(undefined8 *)(pbVar18 + 8) = *(undefined8 *)(pbVar11 + 8);
          *(undefined2 *)(pbVar18 + 0x10) = *(undefined2 *)(pbVar11 + 0x10);
          puVar28 = puVar9;
          goto LAB_0010df6f;
        }
      }
      if (pbVar11 < dest) goto LAB_0010e248;
      pbVar32 = pbVar18 + uVar26;
      puVar28 = puVar9;
      if (uVar6 < 0x10) {
        if (uVar33 == 4) {
          iVar15 = *(int *)pbVar11;
        }
        else if (uVar6 == 2) {
          iVar15 = CONCAT22(*(undefined2 *)pbVar11,*(undefined2 *)pbVar11);
        }
        else {
          if (uVar6 != 1) {
            if (uVar6 < 8) {
              pbVar18[0] = 0;
              pbVar18[1] = 0;
              pbVar18[2] = 0;
              pbVar18[3] = 0;
              *pbVar18 = *pbVar11;
              pbVar18[1] = pbVar11[1];
              pbVar18[2] = pbVar11[2];
              pbVar18[3] = pbVar11[3];
              uVar24 = inc32table[uVar6];
              *(undefined4 *)(pbVar18 + 4) = *(undefined4 *)(pbVar11 + uVar24);
              pbVar11 = pbVar11 + ((ulong)uVar24 - (long)dec64table[uVar6]);
            }
            else {
              *(undefined8 *)pbVar18 = *(undefined8 *)pbVar11;
              pbVar11 = pbVar11 + 8;
            }
            pbVar18 = pbVar18 + 8;
            do {
              *(undefined8 *)pbVar18 = *(undefined8 *)pbVar11;
              pbVar18 = pbVar18 + 8;
              pbVar11 = pbVar11 + 8;
            } while (pbVar18 < pbVar32);
            goto LAB_0010df6f;
          }
          iVar15 = (uint)*pbVar11 * 0x1010101;
        }
        do {
          *(int *)pbVar18 = iVar15;
          *(int *)(pbVar18 + 4) = iVar15;
          pbVar18 = pbVar18 + 8;
        } while (pbVar18 < pbVar32);
        goto LAB_0010df6f;
      }
      do {
        uVar5 = *(undefined8 *)(pbVar18 + -uVar33 + 8);
        *(undefined8 *)pbVar18 = *(undefined8 *)(pbVar18 + -uVar33);
        *(undefined8 *)(pbVar18 + 8) = uVar5;
        uVar5 = *(undefined8 *)(pbVar18 + -uVar33 + 0x10 + 8);
        *(undefined8 *)(pbVar18 + 0x10) = *(undefined8 *)(pbVar18 + -uVar33 + 0x10);
        *(undefined8 *)(pbVar18 + 0x18) = uVar5;
        pbVar18 = pbVar18 + 0x20;
      } while (pbVar18 < pbVar32);
    } while( true );
  }
  prefixSize = (size_t)dictSize;
  if (dictStart + prefixSize == dest) {
    if (dictSize < 0xffff) {
      iVar8 = LZ4_decompress_safe_withSmallPrefix
                        (source,dest,compressedSize,maxOutputSize,prefixSize);
      return iVar8;
    }
    iVar15 = -1;
    if (source != (char *)0x0) {
      if (maxOutputSize == 0) {
        if (compressedSize == 1) {
          iVar15 = -(uint)(*source != '\0');
        }
      }
      else if (compressedSize != 0) {
        puVar1 = (ushort *)(source + compressedSize);
        lVar22 = (long)maxOutputSize;
        if (0x3f < maxOutputSize) {
          lVar17 = 0;
          puVar28 = (ushort *)source;
LAB_0010f0b1:
          pcVar31 = dest + lVar17;
          puVar9 = (ushort *)((long)puVar28 + 1);
          bVar4 = (byte)*puVar28;
          uVar24 = (uint)bVar4;
          uVar33 = (ulong)(uint)(bVar4 >> 4);
          if (bVar4 >> 4 == 0xf) {
            if ((ushort *)((long)puVar1 - 0xfU) <= puVar9) goto LAB_0010f682;
            puVar29 = puVar28 + 1;
            uVar19 = 0;
            puVar28 = puVar28 + 8;
            do {
              puVar16 = puVar28;
              puVar10 = puVar9;
              puVar9 = (ushort *)((long)puVar10 + 1);
              uVar19 = uVar19 + *(byte *)((long)puVar16 + -0xf);
              puVar29 = (ushort *)((long)puVar29 + 1);
              puVar28 = (ushort *)((long)puVar16 + 1);
            } while (puVar16 + -7 < (ushort *)((long)puVar1 - 0xfU) &&
                     *(byte *)((long)puVar16 + -0xf) == 0xff);
            uVar33 = (ulong)uVar19 + 0xf;
            if ((CARRY8((ulong)pcVar31,uVar33)) || ((ulong)-(long)puVar29 < uVar33)) {
              puVar9 = puVar16 + -7;
              goto LAB_0010f682;
            }
            lVar14 = lVar17 + uVar33;
            if (dest + lVar22 + -0x20 < dest + lVar14) goto LAB_0010f4a7;
            puVar28 = (ushort *)((ulong)uVar19 + (long)puVar16 + 1);
            if (puVar1 + -0x10 < puVar28) {
              puVar9 = puVar16 + -7;
              goto LAB_0010f4a7;
            }
            lVar17 = 0;
            do {
              uVar5 = *(undefined8 *)((byte *)((long)puVar9 + lVar17) + 8);
              pcVar2 = pcVar31 + lVar17;
              *(undefined8 *)pcVar2 = *(undefined8 *)((long)puVar9 + lVar17);
              *(undefined8 *)(pcVar2 + 8) = uVar5;
              pbVar30 = (byte *)((long)puVar10 + lVar17 + 0x11);
              uVar5 = *(undefined8 *)(pbVar30 + 8);
              *(undefined8 *)(pcVar2 + 0x10) = *(undefined8 *)pbVar30;
              *(undefined8 *)(pcVar2 + 0x18) = uVar5;
              lVar17 = lVar17 + 0x20;
            } while (pcVar2 + 0x20 < dest + lVar14);
          }
          else {
            lVar14 = lVar17 + uVar33;
            if ((ushort *)((long)puVar1 - 0x11U) < puVar9) goto LAB_0010f4a7;
            uVar5 = *(undefined8 *)((long)puVar28 + 9);
            *(undefined8 *)pcVar31 = *(undefined8 *)puVar9;
            *(undefined8 *)(pcVar31 + 8) = uVar5;
            puVar28 = (ushort *)(uVar33 + (long)puVar9);
          }
          pbVar30 = (byte *)(dest + lVar14);
          uVar6 = *puVar28;
          uVar33 = (ulong)uVar6;
          puVar9 = puVar28 + 1;
          lVar34 = lVar14 - uVar33;
          pbVar32 = (byte *)(dest + lVar34);
          uVar26 = (ulong)(bVar4 & 0xf);
          if (uVar26 == 0xf) {
            if (lVar34 < -0x10000) goto LAB_0010f682;
            uVar24 = 0;
            puVar28 = puVar9;
            do {
              puVar9 = (ushort *)((long)puVar28 + 1);
              if (puVar1 + -2 <= puVar9) goto LAB_0010f682;
              uVar7 = *puVar28;
              uVar24 = uVar24 + (byte)uVar7;
              puVar28 = puVar9;
            } while ((byte)uVar7 == 0xff);
            uVar25 = (ulong)uVar24;
            if ((byte *)(-0x10 - uVar25) < pbVar30) goto LAB_0010f682;
            uVar26 = uVar25 + 0x13;
            if (dest + lVar22 + -0x40 <= pbVar30 + uVar25 + 0x13) goto LAB_0010f553;
LAB_0010f25e:
            if (lVar34 < -0x10000) goto LAB_0010f682;
            lVar17 = lVar14 + uVar26;
            pbVar18 = (byte *)(dest + lVar17);
            puVar28 = puVar9;
            if (0xf < uVar6) {
              do {
                uVar5 = *(undefined8 *)(pbVar30 + -uVar33 + 8);
                *(undefined8 *)pbVar30 = *(undefined8 *)(pbVar30 + -uVar33);
                *(undefined8 *)(pbVar30 + 8) = uVar5;
                uVar5 = *(undefined8 *)(pbVar30 + -uVar33 + 0x10 + 8);
                *(undefined8 *)(pbVar30 + 0x10) = *(undefined8 *)(pbVar30 + -uVar33 + 0x10);
                *(undefined8 *)(pbVar30 + 0x18) = uVar5;
                pbVar30 = pbVar30 + 0x20;
              } while (pbVar30 < pbVar18);
              goto LAB_0010f0b1;
            }
            if (uVar33 == 4) {
              iVar15 = *(int *)pbVar32;
            }
            else if (uVar6 == 2) {
              iVar15 = CONCAT22(*(undefined2 *)pbVar32,*(undefined2 *)pbVar32);
            }
            else {
              if (uVar6 != 1) {
                if (uVar6 < 8) {
                  pbVar30[0] = 0;
                  pbVar30[1] = 0;
                  pbVar30[2] = 0;
                  pbVar30[3] = 0;
                  *pbVar30 = *pbVar32;
                  pbVar30[1] = pbVar32[1];
                  pbVar30[2] = pbVar32[2];
                  pbVar30[3] = pbVar32[3];
                  uVar24 = inc32table[uVar6];
                  *(undefined4 *)(pbVar30 + 4) = *(undefined4 *)(pbVar32 + uVar24);
                  pbVar32 = pbVar32 + ((ulong)uVar24 - (long)dec64table[uVar6]);
                }
                else {
                  *(undefined8 *)pbVar30 = *(undefined8 *)pbVar32;
                  pbVar32 = pbVar32 + 8;
                }
                pbVar30 = pbVar30 + 8;
                do {
                  *(undefined8 *)pbVar30 = *(undefined8 *)pbVar32;
                  pbVar30 = pbVar30 + 8;
                  pbVar32 = pbVar32 + 8;
                } while (pbVar30 < pbVar18);
                goto LAB_0010f0b1;
              }
              iVar15 = (uint)*pbVar32 * 0x1010101;
            }
            do {
              *(int *)pbVar30 = iVar15;
              *(int *)(pbVar30 + 4) = iVar15;
              pbVar30 = pbVar30 + 8;
            } while (pbVar30 < pbVar18);
          }
          else {
            lVar17 = lVar14 + uVar26 + 4;
            uVar26 = uVar26 + 4;
            if (dest + lVar22 + -0x40 <= dest + lVar17) goto LAB_0010f553;
            if (uVar6 < 8) goto LAB_0010f25e;
            *(undefined8 *)pbVar30 = *(undefined8 *)pbVar32;
            *(undefined8 *)(pbVar30 + 8) = *(undefined8 *)(pbVar32 + 8);
            *(undefined2 *)(pbVar30 + 0x10) = *(undefined2 *)(pbVar32 + 0x10);
            puVar28 = puVar9;
          }
          goto LAB_0010f0b1;
        }
        lVar14 = 0;
        puVar28 = (ushort *)source;
        do {
          while( true ) {
            pcVar31 = dest + lVar14;
            puVar9 = (ushort *)((long)puVar28 + 1);
            bVar4 = (byte)*puVar28;
            uVar24 = (uint)bVar4;
            uVar33 = (ulong)(uint)(bVar4 >> 4);
            if (bVar4 >> 4 == 0xf) break;
            if ((source + (long)compressedSize + -0x10 <= puVar9) ||
               (dest + lVar22 + -0x20 < pcVar31)) goto LAB_0010f4a4;
            uVar5 = *(undefined8 *)((long)puVar28 + 9);
            *(undefined8 *)pcVar31 = *(undefined8 *)puVar9;
            *(undefined8 *)(pcVar31 + 8) = uVar5;
            lVar14 = lVar14 + uVar33;
            uVar26 = (ulong)(bVar4 & 0xf);
            puVar28 = (ushort *)((long)puVar9 + uVar33);
            puVar9 = puVar28 + 1;
            uVar6 = *puVar28;
            lVar34 = lVar14 - (ulong)uVar6;
            if ((uVar26 == 0xf) || (uVar6 < 8)) goto LAB_0010f4f6;
            *(undefined8 *)(dest + lVar14) = *(undefined8 *)(dest + lVar34);
            *(undefined8 *)(dest + lVar14 + 8) = *(undefined8 *)(dest + lVar34 + 8);
            *(undefined2 *)(dest + lVar14 + 0x10) = *(undefined2 *)(dest + lVar34 + 0x10);
            lVar14 = lVar14 + uVar26 + 4;
            puVar28 = puVar9;
          }
          if ((ushort *)((long)puVar1 - 0xfU) <= puVar9) goto LAB_0010f682;
          puVar28 = puVar28 + 1;
          uVar19 = 0;
          do {
            uVar6 = *puVar9;
            puVar9 = (ushort *)((long)puVar9 + 1);
            uVar19 = uVar19 + (byte)uVar6;
            puVar28 = (ushort *)((long)puVar28 + 1);
          } while (puVar9 < (ushort *)((long)puVar1 - 0xfU) && (byte)uVar6 == 0xff);
          uVar33 = (ulong)uVar19 + 0xf;
          if ((CARRY8((ulong)pcVar31,uVar33)) || ((ulong)-(long)puVar28 < uVar33))
          goto LAB_0010f682;
LAB_0010f4a4:
          lVar14 = lVar14 + uVar33;
LAB_0010f4a7:
          puVar28 = (ushort *)((long)puVar9 + uVar33);
          if ((dest + lVar22 + -0xc < dest + lVar14) || (puVar1 + -4 < puVar28)) {
            if ((puVar28 == puVar1) && (lVar14 <= lVar22)) {
              memmove(pcVar31,puVar9,uVar33);
              return ((int)pcVar31 + (int)uVar33) - iVar8;
            }
LAB_0010f682:
            return ~(uint)puVar9 + iStack_40;
          }
          do {
            *(undefined8 *)pcVar31 = *(undefined8 *)puVar9;
            pcVar31 = pcVar31 + 8;
            puVar9 = puVar9 + 4;
          } while (pcVar31 < dest + lVar14);
          uVar6 = *puVar28;
          puVar9 = puVar28 + 1;
          lVar34 = lVar14 - (ulong)uVar6;
          uVar26 = (ulong)(uVar24 & 0xf);
LAB_0010f4f6:
          if ((int)uVar26 == 0xf) {
            uVar24 = 0;
            do {
              uVar7 = *puVar9;
              puVar9 = (ushort *)((long)puVar9 + 1);
              uVar24 = uVar24 + (byte)uVar7;
            } while ((byte)uVar7 == 0xff && puVar9 < puVar1 + -2);
            uVar26 = (ulong)uVar24 + 0xf;
            if ((puVar1 + -2 <= puVar9) || (CARRY8((ulong)(dest + lVar14),uVar26)))
            goto LAB_0010f682;
          }
          uVar26 = uVar26 + 4;
LAB_0010f553:
          if (lVar34 < -0x10000) goto LAB_0010f682;
          pcVar31 = dest + lVar14;
          pcVar35 = dest + lVar34;
          lVar14 = lVar14 + uVar26;
          pcVar2 = dest + lVar14;
          if (uVar6 < 8) {
            pcVar31[0] = '\0';
            pcVar31[1] = '\0';
            pcVar31[2] = '\0';
            pcVar31[3] = '\0';
            *pcVar31 = *pcVar35;
            pcVar31[1] = pcVar35[1];
            pcVar31[2] = pcVar35[2];
            pcVar31[3] = pcVar35[3];
            uVar24 = inc32table[uVar6];
            *(undefined4 *)(pcVar31 + 4) = *(undefined4 *)(pcVar35 + uVar24);
            pcVar35 = pcVar35 + ((ulong)uVar24 - (long)dec64table[uVar6]);
          }
          else {
            *(undefined8 *)pcVar31 = *(undefined8 *)pcVar35;
            pcVar35 = pcVar35 + 8;
          }
          pcVar20 = pcVar31 + 8;
          puVar28 = puVar9;
          if (dest + lVar22 + -0xc < pcVar2) {
            if (dest + lVar22 + -5 < pcVar2) goto LAB_0010f682;
            pcVar31 = dest + lVar22 + -7;
            pcVar27 = pcVar35;
            pcVar36 = pcVar20;
            if (pcVar20 < pcVar31) {
              do {
                *(undefined8 *)pcVar36 = *(undefined8 *)pcVar27;
                pcVar36 = pcVar36 + 8;
                pcVar27 = pcVar27 + 8;
              } while (pcVar36 < pcVar31);
              pcVar35 = pcVar35 + ((long)pcVar31 - (long)pcVar20);
              pcVar20 = pcVar31;
            }
            for (; pcVar20 < pcVar2; pcVar20 = pcVar20 + 1) {
              cVar3 = *pcVar35;
              pcVar35 = pcVar35 + 1;
              *pcVar20 = cVar3;
            }
          }
          else {
            *(undefined8 *)pcVar20 = *(undefined8 *)pcVar35;
            if (0x10 < uVar26) {
              pcVar31 = pcVar31 + 0x10;
              do {
                pcVar35 = pcVar35 + 8;
                *(undefined8 *)pcVar31 = *(undefined8 *)pcVar35;
                pcVar31 = pcVar31 + 8;
              } while (pcVar31 < pcVar2);
            }
          }
        } while( true );
      }
    }
    return iVar15;
  }
  if (source == (char *)0x0) {
    return -1;
  }
  pcVar31 = dictStart + prefixSize;
  if (dictStart == (char *)0x0) {
    pcVar31 = (char *)0x0;
  }
  if (maxOutputSize == 0) {
    if (compressedSize != 1) {
      return -1;
    }
    return -(uint)(*source != '\0');
  }
  if (compressedSize == 0) {
    return -1;
  }
  puVar1 = (ushort *)(source + compressedSize);
  pbVar30 = (byte *)(dest + maxOutputSize);
  pbVar32 = (byte *)dest;
  puVar28 = (ushort *)source;
  if (maxOutputSize < 0x40) goto LAB_0010faff;
LAB_0010f777:
  puVar9 = (ushort *)((long)puVar28 + 1);
  bVar4 = (byte)*puVar28;
  uVar33 = (ulong)(uint)(bVar4 >> 4);
  if (bVar4 >> 4 == 0xf) {
    if ((ushort *)((long)puVar1 - 0xfU) <= puVar9) goto LAB_0010faed;
    puVar29 = puVar28 + 1;
    uVar19 = 0;
    puVar28 = puVar28 + 8;
    do {
      puVar16 = puVar9;
      puVar10 = puVar28;
      puVar9 = (ushort *)((long)puVar16 + 1);
      uVar19 = uVar19 + *(byte *)((long)puVar10 + -0xf);
      puVar29 = (ushort *)((long)puVar29 + 1);
      puVar28 = (ushort *)((long)puVar10 + 1);
    } while (puVar10 + -7 < (ushort *)((long)puVar1 - 0xfU) &&
             *(byte *)((long)puVar10 + -0xf) == 0xff);
    uVar33 = (ulong)uVar19 + 0xf;
    pbVar18 = pbVar32 + uVar33;
    if ((CARRY8((ulong)pbVar32,uVar33)) || ((ulong)-(long)puVar29 < uVar33)) {
      puVar9 = puVar10 + -7;
      goto LAB_0010faed;
    }
    uVar24 = (uint)bVar4;
    if (dest + (long)maxOutputSize + -0x20 < pbVar18) goto LAB_0010fbe5;
    puVar28 = (ushort *)((ulong)uVar19 + (long)puVar10 + 1);
    if (puVar1 + -0x10 < puVar28) {
      puVar9 = puVar10 + -7;
      uVar24 = (uint)bVar4;
      goto LAB_0010fbe5;
    }
    lVar22 = 0;
    do {
      uVar5 = *(undefined8 *)((byte *)((long)puVar9 + lVar22) + 8);
      pbVar11 = pbVar32 + lVar22;
      *(undefined8 *)pbVar11 = *(undefined8 *)((long)puVar9 + lVar22);
      *(undefined8 *)(pbVar11 + 8) = uVar5;
      pbVar13 = (byte *)((long)puVar16 + lVar22 + 0x11);
      uVar5 = *(undefined8 *)(pbVar13 + 8);
      *(undefined8 *)(pbVar11 + 0x10) = *(undefined8 *)pbVar13;
      *(undefined8 *)(pbVar11 + 0x18) = uVar5;
      lVar22 = lVar22 + 0x20;
    } while (pbVar11 + 0x20 < pbVar18);
  }
  else {
    pbVar18 = pbVar32 + uVar33;
    uVar24 = (uint)bVar4;
    if ((ushort *)((long)puVar1 - 0x11U) < puVar9) goto LAB_0010fbe5;
    uVar5 = *(undefined8 *)((long)puVar28 + 9);
    *(undefined8 *)pbVar32 = *(undefined8 *)puVar9;
    *(undefined8 *)(pbVar32 + 8) = uVar5;
    puVar28 = (ushort *)(uVar33 + (long)puVar9);
  }
  uVar6 = *puVar28;
  uVar33 = (ulong)uVar6;
  uVar24 = (uint)uVar6;
  puVar9 = puVar28 + 1;
  pbVar11 = pbVar18 + -uVar33;
  uVar26 = (ulong)(bVar4 & 0xf);
  if (uVar26 == 0xf) {
    if ((prefixSize < 0x10000) && (pbVar11 + prefixSize < dest)) goto LAB_0010faed;
    uVar24 = 0;
    puVar28 = puVar9;
    do {
      puVar9 = (ushort *)((long)puVar28 + 1);
      if (puVar1 + -2 <= puVar9) goto LAB_0010faed;
      uVar7 = *puVar28;
      uVar24 = uVar24 + (byte)uVar7;
      puVar28 = puVar9;
    } while ((byte)uVar7 == 0xff);
    uVar26 = (ulong)uVar24;
    if ((byte *)(-0x10 - uVar26) < pbVar18) goto LAB_0010faed;
    __n = uVar26 + 0x13;
    if (pbVar30 + -0x40 <= pbVar18 + uVar26 + 0x13) goto LAB_0010fc8d;
  }
  else {
    __n = uVar26 + 4;
    if (pbVar30 + -0x40 <= pbVar18 + uVar26 + 4) goto LAB_0010fc90;
    if ((dest <= pbVar11) && (7 < uVar6)) {
      *(undefined8 *)pbVar18 = *(undefined8 *)pbVar11;
      *(undefined8 *)(pbVar18 + 8) = *(undefined8 *)(pbVar11 + 8);
      *(undefined2 *)(pbVar18 + 0x10) = *(undefined2 *)(pbVar11 + 0x10);
      pbVar32 = pbVar18 + uVar26 + 4;
      puVar28 = puVar9;
      goto LAB_0010f777;
    }
  }
  if ((prefixSize < 0x10000) && (pbVar11 + prefixSize < dest)) goto LAB_0010faed;
  pbVar13 = pbVar18 + __n;
  pbVar32 = pbVar13;
  puVar28 = puVar9;
  if (pbVar11 < dest) {
    if (pbVar30 + -5 < pbVar13) goto LAB_0010faed;
    uVar26 = (long)dest - (long)pbVar11;
    uVar33 = __n - uVar26;
    if (__n < uVar26 || uVar33 == 0) {
      memmove(pbVar18,pcVar31 + -uVar26,__n);
    }
    else {
      memcpy(pbVar18,pcVar31 + -uVar26,uVar26);
      pbVar32 = pbVar18 + uVar26;
      pbVar18 = (byte *)dest;
      if ((ulong)((long)pbVar32 - (long)dest) < uVar33) {
        for (; pbVar32 < pbVar13; pbVar32 = pbVar32 + 1) {
          *pbVar32 = *pbVar18;
          pbVar18 = pbVar18 + 1;
        }
      }
      else {
        memcpy(pbVar32,dest,uVar33);
        pbVar32 = pbVar13;
      }
    }
  }
  else {
    if (uVar6 < 0x10) {
      if (uVar33 == 4) {
        iVar15 = *(int *)pbVar11;
      }
      else if (uVar6 == 2) {
        iVar15 = CONCAT22(*(undefined2 *)pbVar11,*(undefined2 *)pbVar11);
      }
      else {
        if (uVar6 != 1) {
          if (uVar6 < 8) {
            pbVar18[0] = 0;
            pbVar18[1] = 0;
            pbVar18[2] = 0;
            pbVar18[3] = 0;
            *pbVar18 = *pbVar11;
            pbVar18[1] = pbVar11[1];
            pbVar18[2] = pbVar11[2];
            pbVar18[3] = pbVar11[3];
            uVar24 = inc32table[uVar6];
            *(undefined4 *)(pbVar18 + 4) = *(undefined4 *)(pbVar11 + uVar24);
            pbVar11 = pbVar11 + ((ulong)uVar24 - (long)dec64table[uVar6]);
          }
          else {
            *(undefined8 *)pbVar18 = *(undefined8 *)pbVar11;
            pbVar11 = pbVar11 + 8;
          }
          pbVar18 = pbVar18 + 8;
          do {
            *(undefined8 *)pbVar18 = *(undefined8 *)pbVar11;
            pbVar18 = pbVar18 + 8;
            pbVar11 = pbVar11 + 8;
          } while (pbVar18 < pbVar13);
          goto LAB_0010f777;
        }
        iVar15 = (uint)*pbVar11 * 0x1010101;
      }
      do {
        *(int *)pbVar18 = iVar15;
        *(int *)(pbVar18 + 4) = iVar15;
        pbVar18 = pbVar18 + 8;
      } while (pbVar18 < pbVar13);
      goto LAB_0010f777;
    }
    do {
      uVar5 = *(undefined8 *)(pbVar18 + -uVar33 + 8);
      *(undefined8 *)pbVar18 = *(undefined8 *)(pbVar18 + -uVar33);
      *(undefined8 *)(pbVar18 + 8) = uVar5;
      uVar5 = *(undefined8 *)(pbVar18 + -uVar33 + 0x10 + 8);
      *(undefined8 *)(pbVar18 + 0x10) = *(undefined8 *)(pbVar18 + -uVar33 + 0x10);
      *(undefined8 *)(pbVar18 + 0x18) = uVar5;
      pbVar18 = pbVar18 + 0x20;
    } while (pbVar18 < pbVar13);
  }
  goto LAB_0010f777;
LAB_0010e3e1:
  if (pbVar11 < dest) {
LAB_0010e248:
    return ~(uint)puVar9 + iStack_40;
  }
  pbVar32 = pbVar18 + uVar26;
  if ((uint)uVar33 < 8) {
    pbVar18[0] = 0;
    pbVar18[1] = 0;
    pbVar18[2] = 0;
    pbVar18[3] = 0;
    *pbVar18 = *pbVar11;
    pbVar18[1] = pbVar11[1];
    pbVar18[2] = pbVar11[2];
    pbVar18[3] = pbVar11[3];
    uVar33 = (ulong)((uint)uVar33 << 2);
    uVar25 = (ulong)*(uint *)((long)inc32table + uVar33);
    *(undefined4 *)(pbVar18 + 4) = *(undefined4 *)(pbVar11 + uVar25);
    pbVar11 = pbVar11 + (uVar25 - (long)*(int *)((long)dec64table + uVar33));
  }
  else {
    *(undefined8 *)pbVar18 = *(undefined8 *)pbVar11;
    pbVar11 = pbVar11 + 8;
  }
  pbVar13 = pbVar18 + 8;
  puVar28 = puVar9;
  if (pbVar30 + -0xc < pbVar32) {
    if (pbVar30 + -5 < pbVar32) goto LAB_0010e248;
    pbVar18 = pbVar30 + -7;
    pbVar12 = pbVar11;
    pbVar23 = pbVar13;
    if (pbVar13 < pbVar18) {
      do {
        *(undefined8 *)pbVar23 = *(undefined8 *)pbVar12;
        pbVar23 = pbVar23 + 8;
        pbVar12 = pbVar12 + 8;
      } while (pbVar23 < pbVar18);
      pbVar11 = pbVar11 + ((long)pbVar18 - (long)pbVar13);
      pbVar13 = pbVar18;
    }
    for (; pbVar13 < pbVar32; pbVar13 = pbVar13 + 1) {
      bVar4 = *pbVar11;
      pbVar11 = pbVar11 + 1;
      *pbVar13 = bVar4;
    }
  }
  else {
    *(undefined8 *)pbVar13 = *(undefined8 *)pbVar11;
    if (0x10 < uVar26) {
      pbVar18 = pbVar18 + 0x10;
      do {
        pbVar11 = pbVar11 + 8;
        *(undefined8 *)pbVar18 = *(undefined8 *)pbVar11;
        pbVar18 = pbVar18 + 8;
      } while (pbVar18 < pbVar32);
    }
  }
LAB_0010e2c5:
  while( true ) {
    puVar9 = (ushort *)((long)puVar28 + 1);
    bVar4 = (byte)*puVar28;
    uVar33 = (ulong)(uint)(bVar4 >> 4);
    if (bVar4 >> 4 == 0xf) break;
    if ((source + (long)compressedSize + -0x10 <= puVar9) ||
       (dest + (long)maxOutputSize + -0x20 < pbVar32)) goto LAB_0010e333;
    uVar5 = *(undefined8 *)((long)puVar28 + 9);
    *(undefined8 *)pbVar32 = *(undefined8 *)puVar9;
    *(undefined8 *)(pbVar32 + 8) = uVar5;
    pbVar18 = pbVar32 + uVar33;
    uVar26 = (ulong)(bVar4 & 0xf);
    puVar28 = (ushort *)((long)puVar9 + uVar33);
    puVar9 = puVar28 + 1;
    uVar6 = *puVar28;
    uVar33 = (ulong)uVar6;
    pbVar11 = pbVar18 + -uVar33;
    if (((uVar26 == 0xf) || (uVar6 < 8)) || (pbVar11 < dest)) goto LAB_0010e385;
    *(undefined8 *)pbVar18 = *(undefined8 *)pbVar11;
    *(undefined8 *)(pbVar18 + 8) = *(undefined8 *)(pbVar11 + 8);
    *(undefined2 *)(pbVar18 + 0x10) = *(undefined2 *)(pbVar11 + 0x10);
    pbVar32 = pbVar18 + uVar26 + 4;
    puVar28 = puVar9;
  }
  if ((ushort *)((long)puVar1 - 0xfU) <= puVar9) goto LAB_0010e248;
  puVar28 = puVar28 + 1;
  uVar24 = 0;
  do {
    uVar6 = *puVar9;
    puVar9 = (ushort *)((long)puVar9 + 1);
    uVar24 = uVar24 + (byte)uVar6;
    puVar28 = (ushort *)((long)puVar28 + 1);
  } while (puVar9 < (ushort *)((long)puVar1 - 0xfU) && (byte)uVar6 == 0xff);
  uVar33 = (ulong)uVar24 + 0xf;
  if ((CARRY8((ulong)pbVar32,uVar33)) || ((ulong)-(long)puVar28 < uVar33)) goto LAB_0010e248;
LAB_0010e333:
  pbVar18 = pbVar32 + uVar33;
LAB_0010e337:
  puVar28 = (ushort *)((long)puVar9 + uVar33);
  if ((pbVar30 + -0xc < pbVar18) || (puVar1 + -4 < puVar28)) {
    if ((puVar28 == puVar1) && (pbVar18 <= pbVar30)) {
      memmove(pbVar32,puVar9,uVar33);
      return ((int)pbVar32 + (int)uVar33) - iVar8;
    }
    goto LAB_0010e248;
  }
  do {
    *(undefined8 *)pbVar32 = *(undefined8 *)puVar9;
    pbVar32 = pbVar32 + 8;
    puVar9 = puVar9 + 4;
  } while (pbVar32 < pbVar18);
  uVar33 = (ulong)*puVar28;
  puVar9 = puVar28 + 1;
  pbVar11 = pbVar18 + -uVar33;
  uVar26 = (ulong)(bVar4 & 0xf);
LAB_0010e385:
  if ((int)uVar26 == 0xf) {
    uVar24 = 0;
    do {
      uVar6 = *puVar9;
      puVar9 = (ushort *)((long)puVar9 + 1);
      uVar24 = uVar24 + (byte)uVar6;
    } while ((byte)uVar6 == 0xff && puVar9 < puVar1 + -2);
    uVar26 = (ulong)uVar24 + 0xf;
    if ((puVar1 + -2 <= puVar9) || (CARRY8((ulong)pbVar18,uVar26))) goto LAB_0010e248;
  }
  uVar26 = uVar26 + 4;
  goto LAB_0010e3e1;
LAB_0010fc90:
  if ((prefixSize < 0x10000) && (pbVar11 + prefixSize < dest)) goto LAB_0010faed;
  pbVar13 = pbVar18 + __n;
  pbVar32 = pbVar13;
  puVar28 = puVar9;
  if (pbVar11 < dest) {
    if (pbVar30 + -5 < pbVar13) goto LAB_0010faed;
    uVar26 = (long)dest - (long)pbVar11;
    uVar33 = __n - uVar26;
    if (__n < uVar26 || uVar33 == 0) {
      memmove(pbVar18,pcVar31 + -uVar26,__n);
    }
    else {
      memcpy(pbVar18,pcVar31 + -uVar26,uVar26);
      pbVar32 = pbVar18 + uVar26;
      pbVar18 = (byte *)dest;
      if ((ulong)((long)pbVar32 - (long)dest) < uVar33) {
        for (; pbVar32 < pbVar13; pbVar32 = pbVar32 + 1) {
          *pbVar32 = *pbVar18;
          pbVar18 = pbVar18 + 1;
        }
      }
      else {
        memcpy(pbVar32,dest,uVar33);
        pbVar32 = pbVar13;
      }
    }
  }
  else {
    if (uVar24 < 8) {
      pbVar18[0] = 0;
      pbVar18[1] = 0;
      pbVar18[2] = 0;
      pbVar18[3] = 0;
      *pbVar18 = *pbVar11;
      pbVar18[1] = pbVar11[1];
      pbVar18[2] = pbVar11[2];
      pbVar18[3] = pbVar11[3];
      uVar33 = (ulong)*(uint *)((long)inc32table + (ulong)(uVar24 << 2));
      *(undefined4 *)(pbVar18 + 4) = *(undefined4 *)(pbVar11 + uVar33);
      pbVar11 = pbVar11 + (uVar33 - (long)*(int *)((long)dec64table + (ulong)(uVar24 << 2)));
    }
    else {
      *(undefined8 *)pbVar18 = *(undefined8 *)pbVar11;
      pbVar11 = pbVar11 + 8;
    }
    pbVar12 = pbVar18 + 8;
    if (pbVar30 + -0xc < pbVar13) {
      if (pbVar30 + -5 < pbVar13) goto LAB_0010faed;
      pbVar18 = pbVar30 + -7;
      pbVar23 = pbVar11;
      pbVar21 = pbVar12;
      if (pbVar12 < pbVar18) {
        do {
          *(undefined8 *)pbVar21 = *(undefined8 *)pbVar23;
          pbVar21 = pbVar21 + 8;
          pbVar23 = pbVar23 + 8;
        } while (pbVar21 < pbVar18);
        pbVar11 = pbVar11 + ((long)pbVar18 - (long)pbVar12);
        pbVar12 = pbVar18;
      }
      for (; pbVar12 < pbVar13; pbVar12 = pbVar12 + 1) {
        bVar4 = *pbVar11;
        pbVar11 = pbVar11 + 1;
        *pbVar12 = bVar4;
      }
    }
    else {
      *(undefined8 *)pbVar12 = *(undefined8 *)pbVar11;
      if (0x10 < __n) {
        pbVar18 = pbVar18 + 0x10;
        do {
          pbVar11 = pbVar11 + 8;
          *(undefined8 *)pbVar18 = *(undefined8 *)pbVar11;
          pbVar18 = pbVar18 + 8;
        } while (pbVar18 < pbVar13);
      }
    }
  }
LAB_0010faff:
  while( true ) {
    puVar9 = (ushort *)((long)puVar28 + 1);
    bVar4 = (byte)*puVar28;
    uVar33 = (ulong)(uint)(bVar4 >> 4);
    if (bVar4 >> 4 == 0xf) break;
    if ((source + (long)compressedSize + -0x10 <= puVar9) ||
       (dest + (long)maxOutputSize + -0x20 < pbVar32)) goto LAB_0010fbe1;
    uVar5 = *(undefined8 *)((long)puVar28 + 9);
    *(undefined8 *)pbVar32 = *(undefined8 *)puVar9;
    *(undefined8 *)(pbVar32 + 8) = uVar5;
    pbVar18 = pbVar32 + uVar33;
    uVar26 = (ulong)(bVar4 & 0xf);
    puVar28 = (ushort *)(uVar33 + (long)puVar9);
    puVar9 = puVar28 + 1;
    uVar6 = *puVar28;
    uVar33 = (ulong)uVar6;
    pbVar11 = pbVar18 + -uVar33;
    if (((uVar26 == 0xf) || (uVar6 < 8)) || (pbVar11 < dest)) goto LAB_0010fc33;
    *(undefined8 *)pbVar18 = *(undefined8 *)pbVar11;
    *(undefined8 *)(pbVar18 + 8) = *(undefined8 *)(pbVar11 + 8);
    *(undefined2 *)(pbVar18 + 0x10) = *(undefined2 *)(pbVar11 + 0x10);
    pbVar32 = pbVar18 + uVar26 + 4;
    puVar28 = puVar9;
  }
  if ((ushort *)((long)puVar1 - 0xfU) <= puVar9) goto LAB_0010faed;
  puVar28 = puVar28 + 1;
  uVar24 = 0;
  do {
    uVar6 = *puVar9;
    puVar9 = (ushort *)((long)puVar9 + 1);
    uVar24 = uVar24 + (byte)uVar6;
    puVar28 = (ushort *)((long)puVar28 + 1);
  } while (puVar9 < (ushort *)((long)puVar1 - 0xfU) && (byte)uVar6 == 0xff);
  uVar33 = (ulong)uVar24 + 0xf;
  if ((CARRY8((ulong)pbVar32,uVar33)) || ((ulong)-(long)puVar28 < uVar33)) goto LAB_0010faed;
LAB_0010fbe1:
  pbVar18 = pbVar32 + uVar33;
  uVar24 = (uint)bVar4;
LAB_0010fbe5:
  puVar28 = (ushort *)(uVar33 + (long)puVar9);
  if ((pbVar30 + -0xc < pbVar18) || (puVar1 + -4 < puVar28)) {
    if ((puVar28 == puVar1) && (pbVar18 <= pbVar30)) {
      memmove(pbVar32,puVar9,uVar33);
      return ((int)pbVar32 + (int)uVar33) - iVar8;
    }
LAB_0010faed:
    return ~(uint)puVar9 + iStack_40;
  }
  do {
    *(undefined8 *)pbVar32 = *(undefined8 *)puVar9;
    pbVar32 = pbVar32 + 8;
    puVar9 = puVar9 + 4;
  } while (pbVar32 < pbVar18);
  uVar33 = (ulong)*puVar28;
  puVar9 = puVar28 + 1;
  pbVar11 = pbVar18 + -uVar33;
  uVar26 = (ulong)(uVar24 & 0xf);
LAB_0010fc33:
  if ((int)uVar26 == 0xf) {
    uVar24 = 0;
    do {
      uVar6 = *puVar9;
      puVar9 = (ushort *)((long)puVar9 + 1);
      uVar24 = uVar24 + (byte)uVar6;
    } while ((byte)uVar6 == 0xff && puVar9 < puVar1 + -2);
    uVar26 = (ulong)uVar24 + 0xf;
    if ((puVar1 + -2 <= puVar9) || (CARRY8((ulong)pbVar18,uVar26))) goto LAB_0010faed;
  }
  __n = uVar26 + 4;
LAB_0010fc8d:
  uVar24 = (uint)uVar33;
  goto LAB_0010fc90;
}

Assistant:

int LZ4_decompress_safe_usingDict(const char* source, char* dest, int compressedSize, int maxOutputSize, const char* dictStart, int dictSize)
{
    if (dictSize==0)
        return LZ4_decompress_safe(source, dest, compressedSize, maxOutputSize);
    if (dictStart+dictSize == dest) {
        if (dictSize >= 64 KB - 1) {
            return LZ4_decompress_safe_withPrefix64k(source, dest, compressedSize, maxOutputSize);
        }
        assert(dictSize >= 0);
        return LZ4_decompress_safe_withSmallPrefix(source, dest, compressedSize, maxOutputSize, (size_t)dictSize);
    }
    assert(dictSize >= 0);
    return LZ4_decompress_safe_forceExtDict(source, dest, compressedSize, maxOutputSize, dictStart, (size_t)dictSize);
}